

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

int64_t __thiscall soul::Value::PackedData::getAsInt64(PackedData *this)

{
  Category CVar1;
  Primitive PVar2;
  Type *pTVar3;
  uchar uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  pTVar3 = this->type;
  CVar1 = pTVar3->category;
  if (((5 < CVar1) || ((0x32U >> (CVar1 & 0x1f) & 1) == 0)) &&
     ((CVar1 != vector || (pTVar3->boundingSize != 1)))) {
    throwInternalCompilerError
              ("type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()","getAsInt64",
               0xb4);
  }
  PVar2 = (pTVar3->primitiveType).type;
  if (PVar2 == bool_) {
    uVar4 = getAs<unsigned_char>(this);
    uVar6 = (ulong)(uVar4 != '\0');
  }
  else {
    if (PVar2 == int64) {
      lVar7 = getAs<long>(this);
      return lVar7;
    }
    if (PVar2 == int32) {
      iVar5 = getAs<int>(this);
      uVar6 = (ulong)iVar5;
    }
    else {
      if ((PVar2 & ~void_) != float32) {
        throwInternalCompilerError("getAsInt64",0xbb);
      }
      dVar8 = getAsDouble(this);
      uVar6 = (ulong)dVar8;
    }
  }
  return uVar6;
}

Assistant:

int64_t getAsInt64() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isInteger32())      return getAs<int32_t>();
        if (type.isInteger64())      return getAs<int64_t>();
        if (type.isBool())           return getAs<uint8_t>() != 0 ? 1 : 0;
        if (type.isFloatingPoint())  return static_cast<int64_t> (getAsDouble());

        SOUL_ASSERT_FALSE;
        return {};
    }